

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hungarian-branching.hxx
# Opt level: O1

double __thiscall
lineage::heuristics::branching::MaskedHungarianBranching<lineage::heuristics::PartitionGraph>::
optimize(MaskedHungarianBranching<lineage::heuristics::PartitionGraph> *this)

{
  size_t sVar1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *second;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *first;
  double dVar2;
  double dVar3;
  future<double> second_handle;
  future<double> first_handle;
  future<double> local_70;
  double local_60;
  undefined1 local_58 [16];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  MaskedHungarianBranching<lineage::heuristics::PartitionGraph> *local_40;
  pointer local_38;
  
  (*(this->super_HungarianBranching<lineage::heuristics::PartitionGraph>).
    super_BranchingOptimizer<lineage::heuristics::PartitionGraph>._vptr_BranchingOptimizer[1])();
  sVar1 = PartitionGraph::frameOfPartition
                    ((this->super_HungarianBranching<lineage::heuristics::PartitionGraph>).
                     super_BranchingOptimizer<lineage::heuristics::PartitionGraph>.graph_,this->A_);
  if (sVar1 == 0) {
    first = &this->second_;
    second = &this->third_;
  }
  else {
    if (sVar1 != ((this->super_HungarianBranching<lineage::heuristics::PartitionGraph>).
                  super_BranchingOptimizer<lineage::heuristics::PartitionGraph>.graph_)->data_->
                 problemGraph->numberOfFrames_ - 1) {
      local_70.super___basic_future<double>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)HungarianBranching<lineage::heuristics::PartitionGraph>::optimizeStep;
      local_70.super___basic_future<double>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_58._0_8_ = local_58._0_8_ & 0xffffffffffffff00;
      local_40 = this;
      std::
      async<double(lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>::*)(std::vector<unsigned_long,std::allocator<unsigned_long>>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,bool),lineage::heuristics::branching::MaskedHungarianBranching<lineage::heuristics::PartitionGraph>*,std::vector<unsigned_long,std::allocator<unsigned_long>>&,std::vector<unsigned_long,std::allocator<unsigned_long>>&,bool>
                ((int)local_58 + 8,
                 (offset_in_HungarianBranching<lineage::heuristics::PartitionGraph>_to_subr *)0x1,
                 (MaskedHungarianBranching<lineage::heuristics::PartitionGraph> **)&local_70,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_40,&this->first_,
                 (bool *)&this->second_);
      local_40 = (MaskedHungarianBranching<lineage::heuristics::PartitionGraph> *)
                 HungarianBranching<lineage::heuristics::PartitionGraph>::optimizeStep;
      local_38 = (pointer)0x0;
      local_58._0_8_ = this;
      std::
      async<double(lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>::*)(std::vector<unsigned_long,std::allocator<unsigned_long>>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,bool),lineage::heuristics::branching::MaskedHungarianBranching<lineage::heuristics::PartitionGraph>*,std::vector<unsigned_long,std::allocator<unsigned_long>>&,std::vector<unsigned_long,std::allocator<unsigned_long>>&,bool>
                ((launch)&local_70,
                 (offset_in_HungarianBranching<lineage::heuristics::PartitionGraph>_to_subr *)0x1,
                 &local_40,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_58,
                 &this->second_,(bool *)&this->third_);
      dVar3 = std::future<double>::get((future<double> *)(local_58 + 8));
      dVar2 = std::future<double>::get(&local_70);
      if (local_70.super___basic_future<double>._M_state.
          super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        local_60 = dVar2;
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_70.super___basic_future<double>._M_state.
                   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
        dVar2 = local_60;
      }
      if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
      }
      return dVar3 + dVar2;
    }
    first = &this->first_;
    second = &this->second_;
  }
  dVar2 = HungarianBranching<lineage::heuristics::PartitionGraph>::optimizeStep
                    (&this->super_HungarianBranching<lineage::heuristics::PartitionGraph>,first,
                     second,false);
  return dVar2;
}

Assistant:

inline double
MaskedHungarianBranching<GRAPH>::optimize()
{
    setup();

    const auto centerFrame = this->getFrame(A_);

    // border cases where only one step has to be solved.
    // We handle these separately to avoid unnecessary overhead
    // from std::async.
    if (centerFrame == 0)
        return this->optimizeStep(second_, third_, false);
    if (centerFrame == this->getMaxFrame() - 1)
        return this->optimizeStep(first_, second_, false);

    // solve subproblem in {t-1,t} and {t,t+1} in parallel.
    auto first_handle = std::async(
        std::launch::async, &MaskedHungarianBranching<GRAPH>::optimizeStep,
        this, first_, second_, false);

    auto second_handle = std::async(
        std::launch::async, &MaskedHungarianBranching<GRAPH>::optimizeStep,
        this, second_, third_, false);

    const auto objective = first_handle.get() + second_handle.get();

    return objective;
}